

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-bind.c
# Opt level: O1

int run_test_udp_bind(void)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 unaff_RBX;
  long *plVar3;
  int64_t eval_b_1;
  int64_t eval_b_2;
  sockaddr_in addr;
  uv_udp_t h2;
  uv_udp_t h1;
  long lStack_330;
  long lStack_328;
  undefined1 auStack_320 [16];
  long alStack_310 [23];
  long alStack_258 [23];
  code *pcStack_1a0;
  long local_198;
  long local_190;
  undefined1 local_188 [16];
  long local_178 [23];
  long local_c0 [23];
  
  pcStack_1a0 = (code *)0x1d980e;
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,local_188);
  local_c0[0] = (long)iVar1;
  local_178[0] = 0;
  if (local_c0[0] == 0) {
    pcStack_1a0 = (code *)0x1d9839;
    unaff_RBX = uv_default_loop();
    pcStack_1a0 = (code *)0x1d984c;
    iVar1 = uv_udp_init(unaff_RBX,local_c0);
    local_178[0] = (long)iVar1;
    local_198 = 0;
    if (local_178[0] != 0) goto LAB_001d9998;
    pcStack_1a0 = (code *)0x1d9877;
    iVar1 = uv_udp_init(unaff_RBX,local_178);
    local_198 = (long)iVar1;
    local_190 = 0;
    if (local_198 != 0) goto LAB_001d99a5;
    pcStack_1a0 = (code *)0x1d98a9;
    iVar1 = uv_udp_bind(local_c0,local_188,0);
    local_198 = (long)iVar1;
    local_190 = 0;
    if (local_198 != 0) goto LAB_001d99b2;
    pcStack_1a0 = (code *)0x1d98d8;
    iVar1 = uv_udp_bind(local_178,local_188,0);
    local_198 = (long)iVar1;
    local_190 = -0x62;
    if (local_198 != -0x62) goto LAB_001d99bf;
    pcStack_1a0 = (code *)0x1d9905;
    uv_close(local_c0,0);
    pcStack_1a0 = (code *)0x1d9911;
    uv_close(local_178,0);
    pcStack_1a0 = (code *)0x1d991b;
    iVar1 = uv_run(unaff_RBX,0);
    local_198 = (long)iVar1;
    local_190 = 0;
    if (local_198 != 0) goto LAB_001d99cc;
    pcStack_1a0 = (code *)0x1d994a;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_1a0 = (code *)0x1d9954;
    uv_run(unaff_RBX,0);
    local_198 = 0;
    pcStack_1a0 = (code *)0x1d9964;
    iVar1 = uv_loop_close(unaff_RBX);
    local_190 = (long)iVar1;
    if (local_198 == local_190) {
      pcStack_1a0 = (code *)0x1d997b;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_1a0 = (code *)0x1d9998;
    run_test_udp_bind_cold_1();
LAB_001d9998:
    pcStack_1a0 = (code *)0x1d99a5;
    run_test_udp_bind_cold_2();
LAB_001d99a5:
    pcStack_1a0 = (code *)0x1d99b2;
    run_test_udp_bind_cold_3();
LAB_001d99b2:
    pcStack_1a0 = (code *)0x1d99bf;
    run_test_udp_bind_cold_4();
LAB_001d99bf:
    pcStack_1a0 = (code *)0x1d99cc;
    run_test_udp_bind_cold_5();
LAB_001d99cc:
    pcStack_1a0 = (code *)0x1d99d9;
    run_test_udp_bind_cold_6();
  }
  pcStack_1a0 = run_test_udp_bind_reuseaddr;
  run_test_udp_bind_cold_7();
  plVar3 = &lStack_330;
  pcStack_1a0 = (code *)unaff_RBX;
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,auStack_320);
  alStack_258[0] = (long)iVar1;
  alStack_310[0] = 0;
  if (alStack_258[0] == 0) {
    uVar2 = uv_default_loop();
    iVar1 = uv_udp_init(uVar2,alStack_258);
    alStack_310[0] = (long)iVar1;
    lStack_330 = 0;
    if (alStack_310[0] != 0) goto LAB_001d9b94;
    iVar1 = uv_udp_init(uVar2,alStack_310);
    lStack_330 = (long)iVar1;
    lStack_328 = 0;
    if (lStack_330 != 0) goto LAB_001d9ba1;
    iVar1 = uv_udp_bind(alStack_258,auStack_320,4);
    lStack_330 = (long)iVar1;
    lStack_328 = 0;
    if (lStack_330 != 0) goto LAB_001d9bae;
    iVar1 = uv_udp_bind(alStack_310,auStack_320,4);
    lStack_330 = (long)iVar1;
    lStack_328 = 0;
    if (lStack_330 != 0) goto LAB_001d9bbb;
    uv_close(alStack_258,0);
    uv_close(alStack_310,0);
    iVar1 = uv_run(uVar2,0);
    lStack_330 = (long)iVar1;
    lStack_328 = 0;
    if (lStack_330 == 0) {
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      lStack_330 = 0;
      iVar1 = uv_loop_close(uVar2);
      lStack_328 = (long)iVar1;
      if (lStack_330 == lStack_328) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001d9bd5;
    }
  }
  else {
    run_test_udp_bind_reuseaddr_cold_1();
LAB_001d9b94:
    run_test_udp_bind_reuseaddr_cold_2();
LAB_001d9ba1:
    run_test_udp_bind_reuseaddr_cold_3();
LAB_001d9bae:
    run_test_udp_bind_reuseaddr_cold_4();
LAB_001d9bbb:
    run_test_udp_bind_reuseaddr_cold_5();
  }
  run_test_udp_bind_reuseaddr_cold_6();
LAB_001d9bd5:
  run_test_udp_bind_reuseaddr_cold_7();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(plVar3,0);
  return iVar1;
}

Assistant:

TEST_IMPL(udp_bind) {
  struct sockaddr_in addr;
  uv_loop_t* loop;
  uv_udp_t h1, h2;
  int r;

  ASSERT_OK(uv_ip4_addr("0.0.0.0", TEST_PORT, &addr));

  loop = uv_default_loop();

  r = uv_udp_init(loop, &h1);
  ASSERT_OK(r);

  r = uv_udp_init(loop, &h2);
  ASSERT_OK(r);

  r = uv_udp_bind(&h1, (const struct sockaddr*) &addr, 0);
  ASSERT_OK(r);

  r = uv_udp_bind(&h2, (const struct sockaddr*) &addr, 0);
  ASSERT_EQ(r, UV_EADDRINUSE);

  uv_close((uv_handle_t*) &h1, NULL);
  uv_close((uv_handle_t*) &h2, NULL);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT_OK(r);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}